

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharStringType1Tracer.cpp
# Opt level: O0

EStatusCode __thiscall
CharStringType1Tracer::Type1Div(CharStringType1Tracer *this,LongList *inOperandList)

{
  allocator<char> local_39;
  string local_38;
  LongList *local_18;
  LongList *inOperandList_local;
  CharStringType1Tracer *this_local;
  
  local_18 = inOperandList;
  inOperandList_local = (LongList *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"div",&local_39);
  PrimitiveObjectsWriter::WriteKeyword(&this->mPrimitiveWriter,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return eSuccess;
}

Assistant:

EStatusCode CharStringType1Tracer::Type1Div(const LongList& inOperandList)
{
	mPrimitiveWriter.WriteKeyword("div");
	return PDFHummus::eSuccess;
}